

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

bool __thiscall QPDFObjectHandle::getBoolValue(QPDFObjectHandle *this)

{
  undefined1 uVar1;
  QPDF_Bool *pQVar2;
  string local_38;
  
  pQVar2 = ::qpdf::BaseHandle::as<QPDF_Bool>(&this->super_BaseHandle);
  if (pQVar2 == (QPDF_Bool *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"returning false","");
    typeWarning(this,"boolean",&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar1 = 0;
  }
  else {
    uVar1 = pQVar2->val;
  }
  return (bool)uVar1;
}

Assistant:

bool
QPDFObjectHandle::getBoolValue() const
{
    if (auto boolean = as<QPDF_Bool>()) {
        return boolean->val;
    } else {
        typeWarning("boolean", "returning false");
        QTC::TC("qpdf", "QPDFObjectHandle boolean returning false");
        return false;
    }
}